

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-test-part.cc
# Opt level: O0

ostream * testing::operator<<(ostream *os,TestPartResult *result)

{
  Type TVar1;
  ostream *poVar2;
  char *pcVar3;
  TestPartResult *in_RSI;
  ostream *in_RDI;
  int unaff_retaddr;
  char *in_stack_00000008;
  TestPartResult *in_stack_ffffffffffffff50;
  char *local_88;
  char *local_78;
  string local_30 [32];
  TestPartResult *local_10;
  
  local_10 = in_RSI;
  TestPartResult::file_name(in_stack_ffffffffffffff50);
  TestPartResult::line_number(local_10);
  internal::FormatFileLocation_abi_cxx11_(in_stack_00000008,unaff_retaddr);
  poVar2 = std::operator<<(in_RDI,local_30);
  poVar2 = std::operator<<(poVar2," ");
  TVar1 = TestPartResult::type(local_10);
  if (TVar1 == kSuccess) {
    local_78 = "Success";
  }
  else {
    TVar1 = TestPartResult::type(local_10);
    if (TVar1 == kSkip) {
      local_88 = "Skipped";
    }
    else {
      TVar1 = TestPartResult::type(local_10);
      local_88 = "Non-fatal failure";
      if (TVar1 == kFatalFailure) {
        local_88 = "Fatal failure";
      }
    }
    local_78 = local_88;
  }
  poVar2 = std::operator<<(poVar2,local_78);
  poVar2 = std::operator<<(poVar2,":\n");
  pcVar3 = TestPartResult::message((TestPartResult *)0x1868d4);
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_30);
  return poVar2;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const TestPartResult& result) {
  return os << internal::FormatFileLocation(result.file_name(),
                                            result.line_number())
            << " "
            << (result.type() == TestPartResult::kSuccess ? "Success"
                : result.type() == TestPartResult::kSkip  ? "Skipped"
                : result.type() == TestPartResult::kFatalFailure
                    ? "Fatal failure"
                    : "Non-fatal failure")
            << ":\n"
            << result.message() << std::endl;
}